

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_storage_client.cc
# Opt level: O3

Future<int> * __thiscall
NarpcStorageClient::WriteData
          (Future<int> *__return_storage_ptr__,NarpcStorageClient *this,int key,longlong address,
          shared_ptr<crail::ByteBuffer> *buf)

{
  int iVar1;
  AsyncTask<int> *pAVar2;
  bool bVar3;
  shared_ptr<NarpcWriteResponse> response;
  shared_ptr<NarpcWriteRequest> request;
  undefined1 local_81;
  NarpcWriteResponse *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  NarpcWriteRequest *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<RpcMessage> local_60;
  shared_ptr<RpcMessage> local_50;
  int local_3c;
  RpcClient *local_38;
  longlong local_30;
  
  local_70 = (NarpcWriteRequest *)0x0;
  local_3c = key;
  local_30 = address;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NarpcWriteRequest,std::allocator<NarpcWriteRequest>,int&,long_long&,std::shared_ptr<crail::ByteBuffer>&>
            (&local_68,&local_70,(allocator<NarpcWriteRequest> *)&local_80,&local_3c,&local_30,buf);
  local_80 = (NarpcWriteResponse *)0x0;
  local_38 = &this->rpc_client_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NarpcWriteResponse,std::allocator<NarpcWriteResponse>,RpcClient*>
            (&local_78,&local_80,(allocator<NarpcWriteResponse> *)&local_81,&local_38);
  local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70;
  local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_68._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  local_60.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  local_60.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_78._M_pi;
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = RpcClient::IssueRequest(&this->rpc_client_,&local_50,&local_60);
  if (local_60.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (iVar1 < 0) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = true;
    __return_storage_ptr__->result_ = -1;
    goto LAB_00123e6c;
  }
  pAVar2 = &local_80->super_AsyncTask<int>;
  if (local_80 == (NarpcWriteResponse *)0x0) {
    pAVar2 = (AsyncTask<int> *)0x0;
  }
  if (local_78._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pAVar2;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = false;
    goto LAB_00123e6c;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    UNLOCK();
    bVar3 = __libc_single_threaded != '\0';
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pAVar2;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_78._M_pi;
    if (bVar3) goto LAB_00123e60;
    LOCK();
    (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pAVar2;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_78._M_pi;
LAB_00123e60:
    (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
  }
  __return_storage_ptr__->is_done_ = false;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
LAB_00123e6c:
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Future<int> NarpcStorageClient::WriteData(int key, long long address,
                                          shared_ptr<ByteBuffer> buf) {
  shared_ptr<NarpcWriteRequest> request =
      make_shared<NarpcWriteRequest>(key, address, buf);
  shared_ptr<NarpcWriteResponse> response =
      make_shared<NarpcWriteResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<int>::Failure(-1);
  }
  return Future<int>(response);
}